

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_setGainMode(SoapySDRDevice *device,int direction,size_t channel,bool automatic)

{
  byte in_CL;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  
  SoapySDRDevice_clearError();
  (**(code **)(*in_RDI + 0x160))(in_RDI,in_ESI,in_RDX,in_CL & 1);
  return 0;
}

Assistant:

int SoapySDRDevice_setGainMode(SoapySDRDevice *device, const int direction, const size_t channel, const bool automatic)
{
    __SOAPY_SDR_C_TRY
    device->setGainMode(direction, channel, automatic);
    __SOAPY_SDR_C_CATCH
}